

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305_Simd256.c
# Opt level: O0

void Hacl_MAC_Poly1305_Simd256_poly1305_finish
               (uint8_t *tag,uint8_t *key,Lib_IntVector_Intrinsics_vec256 *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  uint64_t uVar30;
  __uint64_t _Var31;
  __uint64_t _Var32;
  ulong uVar33;
  __uint64_t i;
  undefined1 (*in_RDX) [32];
  long in_RSI;
  uint8_t *in_RDI;
  uint64_t f31;
  uint64_t f30;
  uint64_t r11;
  uint64_t c;
  uint64_t r1;
  uint64_t r0;
  uint64_t f21;
  uint64_t f20;
  uint64_t hi0;
  uint64_t u;
  uint64_t lo0;
  uint64_t u0;
  uint64_t f11;
  uint64_t f10;
  uint64_t hi;
  uint64_t lo;
  uint64_t f41;
  uint64_t f312;
  uint64_t f212;
  uint64_t f112;
  uint64_t f01;
  Lib_IntVector_Intrinsics_vec256 f4;
  Lib_IntVector_Intrinsics_vec256 f3;
  Lib_IntVector_Intrinsics_vec256 f2;
  Lib_IntVector_Intrinsics_vec256 f1;
  Lib_IntVector_Intrinsics_vec256 f00;
  Lib_IntVector_Intrinsics_vec256 f411;
  Lib_IntVector_Intrinsics_vec256 f311;
  Lib_IntVector_Intrinsics_vec256 f211;
  Lib_IntVector_Intrinsics_vec256 f111;
  Lib_IntVector_Intrinsics_vec256 f011;
  Lib_IntVector_Intrinsics_vec256 o4;
  Lib_IntVector_Intrinsics_vec256 o3;
  Lib_IntVector_Intrinsics_vec256 o2;
  Lib_IntVector_Intrinsics_vec256 o1;
  Lib_IntVector_Intrinsics_vec256 o0;
  Lib_IntVector_Intrinsics_vec256 pl;
  Lib_IntVector_Intrinsics_vec256 ph;
  Lib_IntVector_Intrinsics_vec256 mask4;
  Lib_IntVector_Intrinsics_vec256 mask3;
  Lib_IntVector_Intrinsics_vec256 mask2;
  Lib_IntVector_Intrinsics_vec256 mask1;
  Lib_IntVector_Intrinsics_vec256 mask;
  Lib_IntVector_Intrinsics_vec256 ml;
  Lib_IntVector_Intrinsics_vec256 mh;
  Lib_IntVector_Intrinsics_vec256 f42;
  Lib_IntVector_Intrinsics_vec256 f32;
  Lib_IntVector_Intrinsics_vec256 f22;
  Lib_IntVector_Intrinsics_vec256 f12;
  Lib_IntVector_Intrinsics_vec256 f02;
  Lib_IntVector_Intrinsics_vec256 c4;
  Lib_IntVector_Intrinsics_vec256 tmp4;
  Lib_IntVector_Intrinsics_vec256 l8;
  Lib_IntVector_Intrinsics_vec256 c3;
  Lib_IntVector_Intrinsics_vec256 tmp3;
  Lib_IntVector_Intrinsics_vec256 l7;
  Lib_IntVector_Intrinsics_vec256 c2;
  Lib_IntVector_Intrinsics_vec256 tmp2;
  Lib_IntVector_Intrinsics_vec256 l6;
  Lib_IntVector_Intrinsics_vec256 c1;
  Lib_IntVector_Intrinsics_vec256 tmp1;
  Lib_IntVector_Intrinsics_vec256 l5;
  Lib_IntVector_Intrinsics_vec256 c0;
  Lib_IntVector_Intrinsics_vec256 tmp0;
  Lib_IntVector_Intrinsics_vec256 l;
  Lib_IntVector_Intrinsics_vec256 f410;
  Lib_IntVector_Intrinsics_vec256 f310;
  Lib_IntVector_Intrinsics_vec256 f210;
  Lib_IntVector_Intrinsics_vec256 f110;
  Lib_IntVector_Intrinsics_vec256 f010;
  Lib_IntVector_Intrinsics_vec256 c40;
  Lib_IntVector_Intrinsics_vec256 tmp40;
  Lib_IntVector_Intrinsics_vec256 l4;
  Lib_IntVector_Intrinsics_vec256 c30;
  Lib_IntVector_Intrinsics_vec256 tmp30;
  Lib_IntVector_Intrinsics_vec256 l3;
  Lib_IntVector_Intrinsics_vec256 c20;
  Lib_IntVector_Intrinsics_vec256 tmp20;
  Lib_IntVector_Intrinsics_vec256 l2;
  Lib_IntVector_Intrinsics_vec256 c10;
  Lib_IntVector_Intrinsics_vec256 tmp10;
  Lib_IntVector_Intrinsics_vec256 l1;
  Lib_IntVector_Intrinsics_vec256 c00;
  Lib_IntVector_Intrinsics_vec256 tmp00;
  Lib_IntVector_Intrinsics_vec256 l0;
  Lib_IntVector_Intrinsics_vec256 f40;
  Lib_IntVector_Intrinsics_vec256 f33;
  Lib_IntVector_Intrinsics_vec256 f23;
  Lib_IntVector_Intrinsics_vec256 f13;
  Lib_IntVector_Intrinsics_vec256 f0;
  uint8_t *ks;
  Lib_IntVector_Intrinsics_vec256 *acc;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  long local_1680;
  long lStack_1678;
  long lStack_1670;
  long lStack_1668;
  long local_1620;
  long lStack_1618;
  long lStack_1610;
  long lStack_1608;
  long local_15c0;
  long lStack_15b8;
  long lStack_15b0;
  long lStack_15a8;
  long local_1560;
  long lStack_1558;
  long lStack_1550;
  long lStack_1548;
  ulong uStack_a78;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  ulong uStack_5a8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  long local_100;
  long lStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  ulong local_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  
  uStack_a78 = SUB328(ZEXT832(0),4);
  auVar5 = vpaddq_avx2(*in_RDX,ZEXT832(uStack_a78) << 0x40);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_3f0 = auVar2._0_8_;
  uStack_3e8 = auVar2._8_8_;
  auVar26._16_8_ = uStack_3f0;
  auVar26._0_16_ = auVar1;
  auVar26._24_8_ = uStack_3e8;
  auVar6 = vpand_avx2(auVar5,auVar26);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(in_RDX[1],auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_3b0 = auVar2._0_8_;
  uStack_3a8 = auVar2._8_8_;
  auVar25._16_8_ = uStack_3b0;
  auVar25._0_16_ = auVar1;
  auVar25._24_8_ = uStack_3a8;
  auVar7 = vpand_avx2(auVar5,auVar25);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(in_RDX[2],auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_370 = auVar2._0_8_;
  uStack_368 = auVar2._8_8_;
  auVar24._16_8_ = uStack_370;
  auVar24._0_16_ = auVar1;
  auVar24._24_8_ = uStack_368;
  auVar8 = vpand_avx2(auVar5,auVar24);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(in_RDX[3],auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_330 = auVar2._0_8_;
  uStack_328 = auVar2._8_8_;
  auVar23._16_8_ = uStack_330;
  auVar23._0_16_ = auVar1;
  auVar23._24_8_ = uStack_328;
  auVar9 = vpand_avx2(auVar5,auVar23);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(in_RDX[4],auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_2f0 = auVar2._0_8_;
  uStack_2e8 = auVar2._8_8_;
  auVar22._16_8_ = uStack_2f0;
  auVar22._0_16_ = auVar1;
  auVar22._24_8_ = uStack_2e8;
  auVar10 = vpand_avx2(auVar5,auVar22);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar1 = vpunpcklqdq_avx(ZEXT816(5),ZEXT816(5));
  auVar2 = vpunpcklqdq_avx(ZEXT816(5),ZEXT816(5));
  uStack_2b0 = auVar2._0_8_;
  uStack_2a8 = auVar2._8_8_;
  auVar28._16_8_ = uStack_2b0;
  auVar28._0_16_ = auVar1;
  auVar28._24_8_ = uStack_2a8;
  auVar5 = vpmuludq_avx2(auVar5,auVar28);
  auVar5 = vpaddq_avx2(auVar6,auVar5);
  auVar5 = vpaddq_avx2(auVar5,ZEXT832(uStack_a78) << 0x40);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_270 = auVar2._0_8_;
  uStack_268 = auVar2._8_8_;
  auVar21._16_8_ = uStack_270;
  auVar21._0_16_ = auVar1;
  auVar21._24_8_ = uStack_268;
  auVar6 = vpand_avx2(auVar5,auVar21);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(auVar7,auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_230 = auVar2._0_8_;
  uStack_228 = auVar2._8_8_;
  auVar7._16_8_ = uStack_230;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_228;
  auVar7 = vpand_avx2(auVar5,auVar7);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(auVar8,auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  auVar8._16_8_ = uStack_1f0;
  auVar8._0_16_ = auVar1;
  auVar8._24_8_ = uStack_1e8;
  auVar8 = vpand_avx2(auVar5,auVar8);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(auVar9,auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_1b0 = auVar2._0_8_;
  uStack_1a8 = auVar2._8_8_;
  auVar9._16_8_ = uStack_1b0;
  auVar9._0_16_ = auVar1;
  auVar9._24_8_ = uStack_1a8;
  auVar9 = vpand_avx2(auVar5,auVar9);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar5 = vpaddq_avx2(auVar10,auVar5);
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  uStack_170 = auVar2._0_8_;
  uStack_168 = auVar2._8_8_;
  auVar10._16_8_ = uStack_170;
  auVar10._0_16_ = auVar1;
  auVar10._24_8_ = uStack_168;
  auVar10 = vpand_avx2(auVar5,auVar10);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x1a));
  auVar1 = vpunpcklqdq_avx(ZEXT816(5),ZEXT816(5));
  auVar2 = vpunpcklqdq_avx(ZEXT816(5),ZEXT816(5));
  uStack_130 = auVar2._0_8_;
  uStack_128 = auVar2._8_8_;
  auVar27._16_8_ = uStack_130;
  auVar27._0_16_ = auVar1;
  auVar27._24_8_ = uStack_128;
  auVar5 = vpmuludq_avx2(auVar5,auVar27);
  auVar5 = vpaddq_avx2(auVar6,auVar5);
  local_1560 = auVar7._0_8_;
  lStack_1558 = auVar7._8_8_;
  lStack_1550 = auVar7._16_8_;
  lStack_1548 = auVar7._24_8_;
  local_15c0 = auVar8._0_8_;
  lStack_15b8 = auVar8._8_8_;
  lStack_15b0 = auVar8._16_8_;
  lStack_15a8 = auVar8._24_8_;
  local_1620 = auVar9._0_8_;
  lStack_1618 = auVar9._8_8_;
  lStack_1610 = auVar9._16_8_;
  lStack_1608 = auVar9._24_8_;
  local_1680 = auVar10._0_8_;
  lStack_1678 = auVar10._8_8_;
  lStack_1670 = auVar10._16_8_;
  lStack_1668 = auVar10._24_8_;
  auVar3 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3ffffff),ZEXT816(0x3ffffff));
  local_100 = auVar3._0_8_;
  lStack_f8 = auVar3._8_8_;
  lStack_f0 = auVar1._0_8_;
  lStack_e8 = auVar1._8_8_;
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x3fffffb),ZEXT816(0x3fffffb));
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x3fffffb),ZEXT816(0x3fffffb));
  uStack_b0 = auVar1._0_8_;
  uStack_a8 = auVar1._8_8_;
  auVar20._8_8_ = -(ulong)(lStack_1678 == lStack_f8);
  auVar20._0_8_ = -(ulong)(local_1680 == local_100);
  auVar20._16_8_ = -(ulong)(lStack_1670 == lStack_f0);
  auVar20._24_8_ = -(ulong)(lStack_1668 == lStack_e8);
  auVar6._8_8_ = -(ulong)(lStack_1618 == lStack_f8);
  auVar6._0_8_ = -(ulong)(local_1620 == local_100);
  auVar6._16_8_ = -(ulong)(lStack_1610 == lStack_f0);
  auVar6._24_8_ = -(ulong)(lStack_1608 == lStack_e8);
  auVar6 = vpand_avx2(auVar20,auVar6);
  auVar19._8_8_ = -(ulong)(lStack_15b8 == lStack_f8);
  auVar19._0_8_ = -(ulong)(local_15c0 == local_100);
  auVar19._16_8_ = -(ulong)(lStack_15b0 == lStack_f0);
  auVar19._24_8_ = -(ulong)(lStack_15a8 == lStack_e8);
  auVar6 = vpand_avx2(auVar6,auVar19);
  auVar18._8_8_ = -(ulong)(lStack_1558 == lStack_f8);
  auVar18._0_8_ = -(ulong)(local_1560 == local_100);
  auVar18._16_8_ = -(ulong)(lStack_1550 == lStack_f0);
  auVar18._24_8_ = -(ulong)(lStack_1548 == lStack_e8);
  auVar6 = vpand_avx2(auVar6,auVar18);
  auVar29._16_8_ = uStack_b0;
  auVar29._0_16_ = auVar4;
  auVar29._24_8_ = uStack_a8;
  auVar11 = vpcmpgtq_avx2(auVar29,auVar5);
  auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
  auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
  auVar1 = vpinsrd_avx(auVar1,0xffffffff,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
  auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
  auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
  local_80 = auVar1._0_8_;
  uStack_78 = auVar1._8_8_;
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  local_5c0 = auVar11._0_8_;
  uStack_5b8 = auVar11._8_8_;
  uStack_5b0 = auVar11._16_8_;
  uStack_5a8 = auVar11._24_8_;
  auVar17._8_8_ = uStack_5b8 ^ uStack_78;
  auVar17._0_8_ = local_5c0 ^ local_80;
  auVar17._16_8_ = uStack_5b0 ^ uStack_70;
  auVar17._24_8_ = uStack_5a8 ^ uStack_68;
  auVar6 = vpand_avx2(auVar6,auVar17);
  auVar11._16_8_ = lStack_f0;
  auVar11._0_16_ = auVar3;
  auVar11._24_8_ = lStack_e8;
  auVar11 = vpand_avx2(auVar6,auVar11);
  auVar16._16_8_ = uStack_b0;
  auVar16._0_16_ = auVar4;
  auVar16._24_8_ = uStack_a8;
  auVar6 = vpand_avx2(auVar6,auVar16);
  auVar5 = vpsubq_avx2(auVar5,auVar6);
  auVar6 = vpsubq_avx2(auVar7,auVar11);
  auVar7 = vpsubq_avx2(auVar8,auVar11);
  auVar8 = vpsubq_avx2(auVar9,auVar11);
  auVar9 = vpsubq_avx2(auVar10,auVar11);
  local_1880 = auVar5._0_8_;
  uStack_1878 = auVar5._8_8_;
  uStack_1870 = auVar5._16_8_;
  uStack_1868 = auVar5._24_8_;
  local_18a0 = auVar6._0_8_;
  uStack_1898 = auVar6._8_8_;
  uStack_1890 = auVar6._16_8_;
  uStack_1888 = auVar6._24_8_;
  local_18c0 = auVar7._0_8_;
  uStack_18b8 = auVar7._8_8_;
  uStack_18b0 = auVar7._16_8_;
  uStack_18a8 = auVar7._24_8_;
  local_18e0 = auVar8._0_8_;
  uStack_18d8 = auVar8._8_8_;
  uStack_18d0 = auVar8._16_8_;
  uStack_18c8 = auVar8._24_8_;
  local_1900 = auVar9._0_8_;
  uStack_18f8 = auVar9._8_8_;
  uStack_18f0 = auVar9._16_8_;
  uStack_18e8 = auVar9._24_8_;
  *(undefined8 *)*in_RDX = local_1880;
  *(undefined8 *)(*in_RDX + 8) = uStack_1878;
  *(undefined8 *)(*in_RDX + 0x10) = uStack_1870;
  *(undefined8 *)(*in_RDX + 0x18) = uStack_1868;
  *(undefined8 *)in_RDX[1] = local_18a0;
  *(undefined8 *)(in_RDX[1] + 8) = uStack_1898;
  *(undefined8 *)(in_RDX[1] + 0x10) = uStack_1890;
  *(undefined8 *)(in_RDX[1] + 0x18) = uStack_1888;
  *(undefined8 *)in_RDX[2] = local_18c0;
  *(undefined8 *)(in_RDX[2] + 8) = uStack_18b8;
  *(undefined8 *)(in_RDX[2] + 0x10) = uStack_18b0;
  *(undefined8 *)(in_RDX[2] + 0x18) = uStack_18a8;
  *(undefined8 *)in_RDX[3] = local_18e0;
  *(undefined8 *)(in_RDX[3] + 8) = uStack_18d8;
  *(undefined8 *)(in_RDX[3] + 0x10) = uStack_18d0;
  *(undefined8 *)(in_RDX[3] + 0x18) = uStack_18c8;
  *(undefined8 *)in_RDX[4] = local_1900;
  *(undefined8 *)(in_RDX[4] + 8) = uStack_18f8;
  *(undefined8 *)(in_RDX[4] + 0x10) = uStack_18f0;
  *(undefined8 *)(in_RDX[4] + 0x18) = uStack_18e8;
  uVar33 = *(ulong *)*in_RDX;
  lVar12 = *(long *)in_RDX[1];
  uVar13 = *(ulong *)in_RDX[2];
  lVar14 = *(long *)in_RDX[3];
  lVar15 = *(long *)in_RDX[4];
  uVar30 = load64((uint8_t *)(in_RSI + 0x10));
  _Var31 = __uint64_identity(uVar30);
  uVar30 = load64((uint8_t *)(in_RSI + 0x18));
  _Var32 = __uint64_identity(uVar30);
  uVar33 = (uVar33 | lVar12 << 0x1a | uVar13 << 0x34) + _Var31;
  i = __uint64_identity(uVar33);
  store64(in_RDI,i);
  _Var31 = __uint64_identity(((uVar13 >> 0xc | lVar14 << 0xe | lVar15 << 0x28) + _Var32) -
                             ((long)(uVar33 ^ (uVar33 ^ _Var31 | uVar33 - _Var31 ^ _Var31)) >> 0x3f)
                            );
  store64(in_RDI + 8,_Var31);
  return;
}

Assistant:

void
Hacl_MAC_Poly1305_Simd256_poly1305_finish(
  uint8_t *tag,
  uint8_t *key,
  Lib_IntVector_Intrinsics_vec256 *ctx
)
{
  Lib_IntVector_Intrinsics_vec256 *acc = ctx;
  uint8_t *ks = key + 16U;
  Lib_IntVector_Intrinsics_vec256 f0 = acc[0U];
  Lib_IntVector_Intrinsics_vec256 f13 = acc[1U];
  Lib_IntVector_Intrinsics_vec256 f23 = acc[2U];
  Lib_IntVector_Intrinsics_vec256 f33 = acc[3U];
  Lib_IntVector_Intrinsics_vec256 f40 = acc[4U];
  Lib_IntVector_Intrinsics_vec256
  l0 = Lib_IntVector_Intrinsics_vec256_add64(f0, Lib_IntVector_Intrinsics_vec256_zero);
  Lib_IntVector_Intrinsics_vec256
  tmp00 =
    Lib_IntVector_Intrinsics_vec256_and(l0,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c00 = Lib_IntVector_Intrinsics_vec256_shift_right64(l0, 26U);
  Lib_IntVector_Intrinsics_vec256 l1 = Lib_IntVector_Intrinsics_vec256_add64(f13, c00);
  Lib_IntVector_Intrinsics_vec256
  tmp10 =
    Lib_IntVector_Intrinsics_vec256_and(l1,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c10 = Lib_IntVector_Intrinsics_vec256_shift_right64(l1, 26U);
  Lib_IntVector_Intrinsics_vec256 l2 = Lib_IntVector_Intrinsics_vec256_add64(f23, c10);
  Lib_IntVector_Intrinsics_vec256
  tmp20 =
    Lib_IntVector_Intrinsics_vec256_and(l2,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c20 = Lib_IntVector_Intrinsics_vec256_shift_right64(l2, 26U);
  Lib_IntVector_Intrinsics_vec256 l3 = Lib_IntVector_Intrinsics_vec256_add64(f33, c20);
  Lib_IntVector_Intrinsics_vec256
  tmp30 =
    Lib_IntVector_Intrinsics_vec256_and(l3,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c30 = Lib_IntVector_Intrinsics_vec256_shift_right64(l3, 26U);
  Lib_IntVector_Intrinsics_vec256 l4 = Lib_IntVector_Intrinsics_vec256_add64(f40, c30);
  Lib_IntVector_Intrinsics_vec256
  tmp40 =
    Lib_IntVector_Intrinsics_vec256_and(l4,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c40 = Lib_IntVector_Intrinsics_vec256_shift_right64(l4, 26U);
  Lib_IntVector_Intrinsics_vec256
  f010 =
    Lib_IntVector_Intrinsics_vec256_add64(tmp00,
      Lib_IntVector_Intrinsics_vec256_smul64(c40, 5ULL));
  Lib_IntVector_Intrinsics_vec256 f110 = tmp10;
  Lib_IntVector_Intrinsics_vec256 f210 = tmp20;
  Lib_IntVector_Intrinsics_vec256 f310 = tmp30;
  Lib_IntVector_Intrinsics_vec256 f410 = tmp40;
  Lib_IntVector_Intrinsics_vec256
  l = Lib_IntVector_Intrinsics_vec256_add64(f010, Lib_IntVector_Intrinsics_vec256_zero);
  Lib_IntVector_Intrinsics_vec256
  tmp0 =
    Lib_IntVector_Intrinsics_vec256_and(l,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c0 = Lib_IntVector_Intrinsics_vec256_shift_right64(l, 26U);
  Lib_IntVector_Intrinsics_vec256 l5 = Lib_IntVector_Intrinsics_vec256_add64(f110, c0);
  Lib_IntVector_Intrinsics_vec256
  tmp1 =
    Lib_IntVector_Intrinsics_vec256_and(l5,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c1 = Lib_IntVector_Intrinsics_vec256_shift_right64(l5, 26U);
  Lib_IntVector_Intrinsics_vec256 l6 = Lib_IntVector_Intrinsics_vec256_add64(f210, c1);
  Lib_IntVector_Intrinsics_vec256
  tmp2 =
    Lib_IntVector_Intrinsics_vec256_and(l6,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c2 = Lib_IntVector_Intrinsics_vec256_shift_right64(l6, 26U);
  Lib_IntVector_Intrinsics_vec256 l7 = Lib_IntVector_Intrinsics_vec256_add64(f310, c2);
  Lib_IntVector_Intrinsics_vec256
  tmp3 =
    Lib_IntVector_Intrinsics_vec256_and(l7,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c3 = Lib_IntVector_Intrinsics_vec256_shift_right64(l7, 26U);
  Lib_IntVector_Intrinsics_vec256 l8 = Lib_IntVector_Intrinsics_vec256_add64(f410, c3);
  Lib_IntVector_Intrinsics_vec256
  tmp4 =
    Lib_IntVector_Intrinsics_vec256_and(l8,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c4 = Lib_IntVector_Intrinsics_vec256_shift_right64(l8, 26U);
  Lib_IntVector_Intrinsics_vec256
  f02 =
    Lib_IntVector_Intrinsics_vec256_add64(tmp0,
      Lib_IntVector_Intrinsics_vec256_smul64(c4, 5ULL));
  Lib_IntVector_Intrinsics_vec256 f12 = tmp1;
  Lib_IntVector_Intrinsics_vec256 f22 = tmp2;
  Lib_IntVector_Intrinsics_vec256 f32 = tmp3;
  Lib_IntVector_Intrinsics_vec256 f42 = tmp4;
  Lib_IntVector_Intrinsics_vec256 mh = Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL);
  Lib_IntVector_Intrinsics_vec256 ml = Lib_IntVector_Intrinsics_vec256_load64(0x3fffffbULL);
  Lib_IntVector_Intrinsics_vec256 mask = Lib_IntVector_Intrinsics_vec256_eq64(f42, mh);
  Lib_IntVector_Intrinsics_vec256
  mask1 =
    Lib_IntVector_Intrinsics_vec256_and(mask,
      Lib_IntVector_Intrinsics_vec256_eq64(f32, mh));
  Lib_IntVector_Intrinsics_vec256
  mask2 =
    Lib_IntVector_Intrinsics_vec256_and(mask1,
      Lib_IntVector_Intrinsics_vec256_eq64(f22, mh));
  Lib_IntVector_Intrinsics_vec256
  mask3 =
    Lib_IntVector_Intrinsics_vec256_and(mask2,
      Lib_IntVector_Intrinsics_vec256_eq64(f12, mh));
  Lib_IntVector_Intrinsics_vec256
  mask4 =
    Lib_IntVector_Intrinsics_vec256_and(mask3,
      Lib_IntVector_Intrinsics_vec256_lognot(Lib_IntVector_Intrinsics_vec256_gt64(ml, f02)));
  Lib_IntVector_Intrinsics_vec256 ph = Lib_IntVector_Intrinsics_vec256_and(mask4, mh);
  Lib_IntVector_Intrinsics_vec256 pl = Lib_IntVector_Intrinsics_vec256_and(mask4, ml);
  Lib_IntVector_Intrinsics_vec256 o0 = Lib_IntVector_Intrinsics_vec256_sub64(f02, pl);
  Lib_IntVector_Intrinsics_vec256 o1 = Lib_IntVector_Intrinsics_vec256_sub64(f12, ph);
  Lib_IntVector_Intrinsics_vec256 o2 = Lib_IntVector_Intrinsics_vec256_sub64(f22, ph);
  Lib_IntVector_Intrinsics_vec256 o3 = Lib_IntVector_Intrinsics_vec256_sub64(f32, ph);
  Lib_IntVector_Intrinsics_vec256 o4 = Lib_IntVector_Intrinsics_vec256_sub64(f42, ph);
  Lib_IntVector_Intrinsics_vec256 f011 = o0;
  Lib_IntVector_Intrinsics_vec256 f111 = o1;
  Lib_IntVector_Intrinsics_vec256 f211 = o2;
  Lib_IntVector_Intrinsics_vec256 f311 = o3;
  Lib_IntVector_Intrinsics_vec256 f411 = o4;
  acc[0U] = f011;
  acc[1U] = f111;
  acc[2U] = f211;
  acc[3U] = f311;
  acc[4U] = f411;
  Lib_IntVector_Intrinsics_vec256 f00 = acc[0U];
  Lib_IntVector_Intrinsics_vec256 f1 = acc[1U];
  Lib_IntVector_Intrinsics_vec256 f2 = acc[2U];
  Lib_IntVector_Intrinsics_vec256 f3 = acc[3U];
  Lib_IntVector_Intrinsics_vec256 f4 = acc[4U];
  uint64_t f01 = Lib_IntVector_Intrinsics_vec256_extract64(f00, 0U);
  uint64_t f112 = Lib_IntVector_Intrinsics_vec256_extract64(f1, 0U);
  uint64_t f212 = Lib_IntVector_Intrinsics_vec256_extract64(f2, 0U);
  uint64_t f312 = Lib_IntVector_Intrinsics_vec256_extract64(f3, 0U);
  uint64_t f41 = Lib_IntVector_Intrinsics_vec256_extract64(f4, 0U);
  uint64_t lo = (f01 | f112 << 26U) | f212 << 52U;
  uint64_t hi = (f212 >> 12U | f312 << 14U) | f41 << 40U;
  uint64_t f10 = lo;
  uint64_t f11 = hi;
  uint64_t u0 = load64_le(ks);
  uint64_t lo0 = u0;
  uint64_t u = load64_le(ks + 8U);
  uint64_t hi0 = u;
  uint64_t f20 = lo0;
  uint64_t f21 = hi0;
  uint64_t r0 = f10 + f20;
  uint64_t r1 = f11 + f21;
  uint64_t c = (r0 ^ ((r0 ^ f20) | ((r0 - f20) ^ f20))) >> 63U;
  uint64_t r11 = r1 + c;
  uint64_t f30 = r0;
  uint64_t f31 = r11;
  store64_le(tag, f30);
  store64_le(tag + 8U, f31);
}